

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::setComment(Value *this,char *comment,CommentPlacement placement)

{
  undefined8 *puVar1;
  CommentInfo *pCVar2;
  
  pCVar2 = this->comments_;
  if (pCVar2 == (CommentInfo *)0x0) {
    puVar1 = (undefined8 *)operator_new__(0x20);
    *puVar1 = 3;
    pCVar2 = (CommentInfo *)(puVar1 + 1);
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    this->comments_ = pCVar2;
  }
  CommentInfo::setComment(pCVar2 + placement,comment);
  return;
}

Assistant:

void Value::setComment(const char* comment, CommentPlacement placement) {
  if (!comments_)
    comments_ = new CommentInfo[numberOfCommentPlacement];
  comments_[placement].setComment(comment);
}